

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void * pugi::impl::anon_unknown_0::document_buffer_order(xpath_node *xnode)

{
  xml_document_struct *pxVar1;
  xpath_node *in_RDI;
  xml_attribute_struct *attr;
  xml_node_struct *node;
  xpath_node *in_stack_ffffffffffffffc8;
  xml_attribute local_30;
  xml_attribute_struct *local_28;
  xml_node local_20;
  xml_node_struct *local_18;
  xpath_node *local_10;
  
  local_10 = in_RDI;
  local_20 = xpath_node::node(in_stack_ffffffffffffffc8);
  local_18 = xml_node::internal_object(&local_20);
  if (local_18 == (xml_node_struct *)0x0) {
    local_30 = xpath_node::attribute(local_10);
    local_28 = xml_attribute::internal_object(&local_30);
    if (local_28 == (xml_attribute_struct *)0x0) {
      return (void *)0x0;
    }
    pxVar1 = get_document<pugi::xml_attribute_struct>(local_28);
    if (((pxVar1->super_xml_node_struct).header & 0x40) == 0) {
      if ((local_28->header & 0x60) == 0) {
        return local_28->name;
      }
      if ((local_28->header & 0x50) == 0) {
        return local_28->value;
      }
    }
    return (void *)0x0;
  }
  pxVar1 = get_document<pugi::xml_node_struct>(local_18);
  if (((pxVar1->super_xml_node_struct).header & 0x40) == 0) {
    if ((local_18->name != (char_t *)0x0) && ((local_18->header & 0x60) == 0)) {
      return local_18->name;
    }
    if ((local_18->value != (char_t *)0x0) && ((local_18->header & 0x50) == 0)) {
      return local_18->value;
    }
  }
  return (void *)0x0;
}

Assistant:

PUGI_IMPL_FN const void* document_buffer_order(const xpath_node& xnode)
	{
		xml_node_struct* node = xnode.node().internal_object();

		if (node)
		{
			if ((get_document(node).header & xml_memory_page_contents_shared_mask) == 0)
			{
				if (node->name && (node->header & impl::xml_memory_page_name_allocated_or_shared_mask) == 0) return node->name;
				if (node->value && (node->header & impl::xml_memory_page_value_allocated_or_shared_mask) == 0) return node->value;
			}

			return NULL;
		}

		xml_attribute_struct* attr = xnode.attribute().internal_object();

		if (attr)
		{
			if ((get_document(attr).header & xml_memory_page_contents_shared_mask) == 0)
			{
				if ((attr->header & impl::xml_memory_page_name_allocated_or_shared_mask) == 0) return attr->name;
				if ((attr->header & impl::xml_memory_page_value_allocated_or_shared_mask) == 0) return attr->value;
			}

			return NULL;
		}

		return NULL;
	}